

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  int iVar2;
  uint32_t uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float local_53c;
  float local_538;
  float local_534;
  float length;
  float nz;
  float ny;
  float nx;
  float bz;
  float by;
  float bx;
  float az;
  float ay;
  float ax;
  float z2;
  float y2;
  float x2;
  float z1;
  float y1;
  float x1;
  float z0;
  float y0;
  float x0;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  uint32_t t;
  int output_as_ply;
  int output_as_stl;
  trico_stream_type st;
  uint32_t nr_of_attributes;
  uint32_t nr_of_texcoords;
  uint32_t nr_of_vertex_colors;
  uint32_t nr_of_vertex_normals;
  uint32_t nr_of_triangle_normals;
  uint32_t nr_of_triangles;
  uint32_t nr_of_vertices;
  uint16_t *attributes;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  uint32_t *tria_indices;
  float *vertices;
  void *arch;
  longlong fl;
  char *buffer;
  FILE *f;
  longlong size;
  char *pcStack_438;
  int idx;
  char *ptr;
  char local_428 [4];
  int j;
  char new_filename [1024];
  char *pcStack_20;
  int output_filename;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    print_help();
    argv_local._4_4_ = -1;
  }
  else {
    pcStack_20 = (char *)0x0;
    new_filename[0x3fc] = '\0';
    new_filename[0x3fd] = '\0';
    new_filename[0x3fe] = '\0';
    new_filename[0x3ff] = '\0';
    for (ptr._4_4_ = 1; ptr._4_4_ < argc; ptr._4_4_ = ptr._4_4_ + 1) {
      iVar2 = strcmp(argv[ptr._4_4_],"-i");
      if (iVar2 == 0) {
        if (ptr._4_4_ == argc + -1) {
          printf("I expect a filename after command -i\n");
          return -1;
        }
        ptr._4_4_ = ptr._4_4_ + 1;
        pcStack_20 = argv[ptr._4_4_];
      }
      else {
        iVar2 = strcmp(argv[ptr._4_4_],"-o");
        if (iVar2 != 0) {
          printf("Unknown command %s\n",argv[ptr._4_4_]);
          return -1;
        }
        if (ptr._4_4_ == argc + -1) {
          printf("I expect a filename after command -o\n");
          return -1;
        }
        ptr._4_4_ = ptr._4_4_ + 1;
        size._4_4_ = 0;
        pcStack_438 = argv[ptr._4_4_];
        while (*pcStack_438 != '\0') {
          local_428[size._4_4_] = *pcStack_438;
          size._4_4_ = size._4_4_ + 1;
          pcStack_438 = pcStack_438 + 1;
        }
        local_428[size._4_4_] = '\0';
        new_filename[0x3fc] = '\x01';
        new_filename[0x3fd] = '\0';
        new_filename[0x3fe] = '\0';
        new_filename[0x3ff] = '\0';
      }
    }
    if (pcStack_20 == (char *)0x0) {
      printf("An input file name is required\n");
      argv_local._4_4_ = -1;
    }
    else {
      f = (FILE *)fsize(pcStack_20);
      if ((long)f < 0) {
        printf("There was an error reading file %s\n",pcStack_20);
        argv_local._4_4_ = -1;
      }
      else {
        buffer = (char *)fopen(pcStack_20,"rb");
        if ((FILE *)buffer == (FILE *)0x0) {
          printf("Cannot open file: %s\n",pcStack_20);
          argv_local._4_4_ = -1;
        }
        else {
          fl = (longlong)malloc((size_t)f);
          arch = (void *)fread((void *)fl,1,(size_t)f,(FILE *)buffer);
          if ((FILE *)arch == f) {
            fclose((FILE *)buffer);
            vertices = (float *)trico_open_archive_for_reading((uint8_t *)fl,(uint64_t)f);
            if (vertices == (float *)0x0) {
              printf("The input file %s is not a trico archive.\n",pcStack_20);
              argv_local._4_4_ = -1;
            }
            else {
              tria_indices = (uint32_t *)0x0;
              triangle_normals = (float *)0x0;
              vertex_normals = (float *)0x0;
              vertex_colors = (uint32_t *)0x0;
              texcoords = (float *)0x0;
              attributes = (uint16_t *)0x0;
              _nr_of_triangles = (uint16_t *)0x0;
              nr_of_triangle_normals = 0;
              nr_of_vertex_normals = 0;
              output_as_ply = trico_get_next_stream_type(vertices);
              while (output_as_ply != 0) {
                switch(output_as_ply) {
                case 1:
                  nr_of_triangle_normals = trico_get_number_of_vertices(vertices);
                  tria_indices = (uint32_t *)malloc((ulong)(nr_of_triangle_normals * 3) << 2);
                  iVar2 = trico_read_vertices(vertices,(float **)&tria_indices);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the vertices\n");
                    return -1;
                  }
                  break;
                default:
                  trico_skip_next_stream(vertices);
                  break;
                case 3:
                  nr_of_vertex_normals = trico_get_number_of_triangles(vertices);
                  triangle_normals = (float *)malloc((ulong)(nr_of_vertex_normals * 3) << 2);
                  iVar2 = trico_read_triangles(vertices,(uint32_t **)&triangle_normals);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the triangles\n");
                    return -1;
                  }
                  break;
                case 7:
                  uVar3 = trico_get_number_of_uvs(vertices);
                  attributes = (uint16_t *)malloc((ulong)(uVar3 << 1) << 2);
                  iVar2 = trico_read_uv_per_triangle(vertices,(float **)&attributes);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the texture coordinates\n");
                    return -1;
                  }
                  break;
                case 9:
                  uVar3 = trico_get_number_of_normals(vertices);
                  vertex_colors = (uint32_t *)malloc((ulong)(uVar3 * 3) << 2);
                  iVar2 = trico_read_vertex_normals(vertices,(float **)&vertex_colors);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the vertex normals\n");
                    return -1;
                  }
                  break;
                case 0xb:
                  uVar3 = trico_get_number_of_normals(vertices);
                  vertex_normals = (float *)malloc((ulong)(uVar3 * 3) << 2);
                  iVar2 = trico_read_triangle_normals(vertices,&vertex_normals);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the triangle normals\n");
                    return -1;
                  }
                  break;
                case 0xd:
                  uVar3 = trico_get_number_of_colors(vertices);
                  texcoords = (float *)malloc((ulong)uVar3 << 2);
                  iVar2 = trico_read_vertex_colors(vertices,(uint32_t **)&texcoords);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the vertex colors\n");
                    return -1;
                  }
                  break;
                case 0x12:
                  uVar3 = trico_get_number_of_attributes(vertices);
                  _nr_of_triangles = (uint16_t *)malloc((ulong)uVar3 << 1);
                  iVar2 = trico_read_attributes_uint16(vertices,(uint16_t **)&nr_of_triangles);
                  if (iVar2 == 0) {
                    free(tria_indices);
                    free(vertex_normals);
                    free(vertex_colors);
                    free(texcoords);
                    free(attributes);
                    free(triangle_normals);
                    free(_nr_of_triangles);
                    trico_close_archive(vertices);
                    free((void *)fl);
                    printf("Something went wrong when reading the attributes\n");
                    return -1;
                  }
                }
                output_as_ply = trico_get_next_stream_type(vertices);
              }
              trico_close_archive(vertices);
              free((void *)fl);
              t = 0;
              v0 = 0;
              if (new_filename._1020_4_ != 0) {
                t = extension_is_stl(local_428);
                v0 = extension_is_ply(local_428);
              }
              if ((t == 0) && (v0 == 0)) {
                if ((texcoords == (float *)0x0) &&
                   ((attributes == (uint16_t *)0x0 && (vertex_colors == (uint32_t *)0x0)))) {
                  t = 1;
                }
                else {
                  v0 = 1;
                }
              }
              if (new_filename._1020_4_ == 0) {
                if (v0 == 0) {
                  change_extension_to_stl(local_428,pcStack_20);
                }
                else {
                  change_extension_to_ply(local_428,pcStack_20);
                }
              }
              if ((t != 0) && (vertex_normals == (float *)0x0)) {
                vertex_normals = (float *)malloc((ulong)(nr_of_vertex_normals * 3) << 2);
                for (v1 = 0; v1 < nr_of_vertex_normals; v1 = v1 + 1) {
                  fVar9 = triangle_normals[v1 * 3];
                  fVar6 = triangle_normals[v1 * 3 + 1];
                  fVar1 = triangle_normals[v1 * 3 + 2];
                  fVar4 = (float)tria_indices[(uint)((int)fVar6 * 3)] -
                          (float)tria_indices[(uint)((int)fVar9 * 3)];
                  fVar5 = (float)tria_indices[(int)fVar6 * 3 + 1] -
                          (float)tria_indices[(int)fVar9 * 3 + 1];
                  fVar6 = (float)tria_indices[(int)fVar6 * 3 + 2] -
                          (float)tria_indices[(int)fVar9 * 3 + 2];
                  fVar7 = (float)tria_indices[(uint)((int)fVar1 * 3)] -
                          (float)tria_indices[(uint)((int)fVar9 * 3)];
                  fVar8 = (float)tria_indices[(int)fVar1 * 3 + 1] -
                          (float)tria_indices[(int)fVar9 * 3 + 1];
                  fVar9 = (float)tria_indices[(int)fVar1 * 3 + 2] -
                          (float)tria_indices[(int)fVar9 * 3 + 2];
                  local_534 = fVar5 * fVar9 + -(fVar6 * fVar8);
                  local_538 = fVar6 * fVar7 + -(fVar4 * fVar9);
                  local_53c = fVar4 * fVar8 + -(fVar5 * fVar7);
                  dVar10 = sqrt((double)(local_53c * local_53c +
                                        local_534 * local_534 + local_538 * local_538));
                  fVar9 = (float)dVar10;
                  if ((fVar9 != 0.0) || (NAN(fVar9))) {
                    local_534 = local_534 / fVar9;
                  }
                  vertex_normals[v1 * 3] = local_534;
                  if ((fVar9 != 0.0) || (NAN(fVar9))) {
                    local_538 = local_538 / fVar9;
                  }
                  vertex_normals[v1 * 3 + 1] = local_538;
                  if ((fVar9 != 0.0) || (NAN(fVar9))) {
                    local_53c = local_53c / fVar9;
                  }
                  vertex_normals[v1 * 3 + 2] = local_53c;
                }
              }
              if (t == 0) {
                iVar2 = trico_write_ply(nr_of_triangle_normals,(float *)tria_indices,
                                        (float *)vertex_colors,(uint32_t *)texcoords,
                                        nr_of_vertex_normals,(uint32_t *)triangle_normals,
                                        (float *)attributes,local_428);
                if (iVar2 == 0) {
                  printf("Could not write to %s\n",local_428);
                  return -1;
                }
              }
              else {
                iVar2 = trico_write_stl((float *)tria_indices,(uint32_t *)triangle_normals,
                                        nr_of_vertex_normals,vertex_normals,_nr_of_triangles,
                                        local_428);
                if (iVar2 == 0) {
                  printf("Could not write to %s\n",local_428);
                  return -1;
                }
              }
              free(tria_indices);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(attributes);
              free(triangle_normals);
              free(_nr_of_triangles);
              argv_local._4_4_ = 0;
            }
          }
          else {
            printf("There was an error reading file %s\n",pcStack_20);
            fclose((FILE *)buffer);
            argv_local._4_4_ = -1;
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  int output_filename = 0;
  char new_filename[1024];
  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }


  long long size = fsize(filename);
  if (size < 0)
    {
    printf("There was an error reading file %s\n", filename);
    return -1;
    }

  FILE* f = fopen(filename, "rb");
  if (!f)
    {
    printf("Cannot open file: %s\n", filename);
    return -1;
    }
  char* buffer = (char*)malloc(size);
  long long fl = (long long)fread(buffer, 1, size, f);
  if (fl != size)
    {
    printf("There was an error reading file %s\n", filename);
    fclose(f);
    return -1;
    }
  fclose(f);

  void* arch = trico_open_archive_for_reading((const uint8_t*)buffer, size);
  if (!arch)
    {
    printf("The input file %s is not a trico archive.\n", filename);
    return -1;
    }

  float* vertices = NULL;
  uint32_t* tria_indices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;
  uint32_t nr_of_vertices = 0;
  uint32_t nr_of_triangles = 0;
  uint32_t nr_of_triangle_normals = 0;
  uint32_t nr_of_vertex_normals = 0;
  uint32_t nr_of_vertex_colors = 0;
  uint32_t nr_of_texcoords = 0;
  uint32_t nr_of_attributes = 0;

  enum trico_stream_type st = trico_get_next_stream_type(arch);
  while (!st == trico_empty)
    {
    switch (st)
      {
      case trico_vertex_float_stream:
      {
      nr_of_vertices = trico_get_number_of_vertices(arch);
      vertices = (float*)malloc(nr_of_vertices * 3 * sizeof(float));
      if (!trico_read_vertices(arch, &vertices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertices\n");
        return -1;
        }
      break;
      }
      case trico_triangle_normal_float_stream:
      {
      nr_of_triangle_normals = trico_get_number_of_normals(arch);
      triangle_normals = (float*)malloc(nr_of_triangle_normals * 3 * sizeof(float));
      if (!trico_read_triangle_normals(arch, &triangle_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangle normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_normal_float_stream:
      {
      nr_of_vertex_normals = trico_get_number_of_normals(arch);
      vertex_normals = (float*)malloc(nr_of_vertex_normals * 3 * sizeof(float));
      if (!trico_read_vertex_normals(arch, &vertex_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_color_stream:
      {
      nr_of_vertex_colors = trico_get_number_of_colors(arch);
      vertex_colors = (uint32_t*)malloc(nr_of_vertex_colors * sizeof(uint32_t));
      if (!trico_read_vertex_colors(arch, &vertex_colors))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex colors\n");
        return -1;
        }
      break;
      }
      case trico_triangle_uint32_stream:
      {
      nr_of_triangles = trico_get_number_of_triangles(arch);
      tria_indices = (uint32_t*)malloc(nr_of_triangles * 3 * sizeof(uint32_t));
      if (!trico_read_triangles(arch, &tria_indices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangles\n");
        return -1;
        }
      break;
      }
      case trico_attribute_uint16_stream:
      {
      nr_of_attributes = trico_get_number_of_attributes(arch);
      attributes = (uint16_t*)malloc(nr_of_attributes * sizeof(uint16_t));
      if (!trico_read_attributes_uint16(arch, &attributes))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the attributes\n");
        return -1;
        }
      break;
      }
      case trico_uv_per_triangle_float_stream:
      {
      nr_of_texcoords = trico_get_number_of_uvs(arch);
      texcoords = (float*)malloc(nr_of_texcoords * 2 * sizeof(float));
      if (!trico_read_uv_per_triangle(arch, &texcoords))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the texture coordinates\n");
        return -1;
        }
      break;
      }
      default:
      {
      trico_skip_next_stream(arch);
      break;
      }
      }

    st = trico_get_next_stream_type(arch);
    }

  trico_close_archive(arch);
  free(buffer);

  int output_as_stl = 0;
  int output_as_ply = 0;

  if (output_filename)
    {
    output_as_stl = extension_is_stl(new_filename);
    output_as_ply = extension_is_ply(new_filename);
    }

  if (!output_as_stl && !output_as_ply)
    {
    if (vertex_colors || texcoords || vertex_normals)
      output_as_ply = 1;
    else
      output_as_stl = 1;
    }

  if (!output_filename)
    {
    if (output_as_ply)
      change_extension_to_ply(new_filename, filename);
    else
      change_extension_to_stl(new_filename, filename);
    }

  if (output_as_stl && (triangle_normals == NULL))
    {
    triangle_normals = (float*)malloc(nr_of_triangles * 3 * sizeof(float));
    for (uint32_t t = 0; t < nr_of_triangles; ++t)
      {
      const uint32_t v0 = tria_indices[t * 3];
      const uint32_t v1 = tria_indices[t * 3 + 1];
      const uint32_t v2 = tria_indices[t * 3 + 2];
      const float x0 = vertices[v0 * 3];
      const float y0 = vertices[v0 * 3 + 1];
      const float z0 = vertices[v0 * 3 + 2];
      const float x1 = vertices[v1 * 3];
      const float y1 = vertices[v1 * 3 + 1];
      const float z1 = vertices[v1 * 3 + 2];
      const float x2 = vertices[v2 * 3];
      const float y2 = vertices[v2 * 3 + 1];
      const float z2 = vertices[v2 * 3 + 2];
      const float ax = x1 - x0;
      const float ay = y1 - y0;
      const float az = z1 - z0;
      const float bx = x2 - x0;
      const float by = y2 - y0;
      const float bz = z2 - z0;
      const float nx = ay * bz - az * by;
      const float ny = az * bx - ax * bz;
      const float nz = ax * by - ay * bx;
      const float length = (float)sqrt((double)(nx*nx + ny * ny + nz * nz));
      triangle_normals[t * 3] = length ? nx / length : nx;
      triangle_normals[t * 3 + 1] = length ? ny / length : ny;
      triangle_normals[t * 3 + 2] = length ? nz / length : nz;
      }
    }

  if (output_as_stl)
    {
    if (!trico_write_stl(vertices, tria_indices, nr_of_triangles, triangle_normals, attributes, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  else
    {
    if (!trico_write_ply(nr_of_vertices, vertices, vertex_normals, vertex_colors, nr_of_triangles, tria_indices, texcoords, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  
  free(vertices);
  free(triangle_normals);
  free(vertex_normals);
  free(vertex_colors);
  free(texcoords);
  free(tria_indices);
  free(attributes);
  return 0;
  }